

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

void __thiscall
Parser_importComponentMadeConcrete_Test::TestBody(Parser_importComponentMadeConcrete_Test *this)

{
  bool bVar1;
  byte bVar2;
  allocator<char> aaStack_98 [8];
  string local_90 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_88;
  char *local_80 [4];
  AssertionResult gtest_ar_;
  ModelPtr model;
  ParserPtr parser;
  string modelString;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&modelString,
             "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n<model xmlns=\"http://www.cellml.org/cellml/2.0#\">\n  <import xmlns:xlink=\"http://www.w3.org/1999/xlink\" xlink:href=\"some-other-model.xml\">\n    <component component_ref=\"importMe\" name=\"importedComponent\"/>\n  </import>\n  <component name=\"parentComponent\"/>\n  <component name=\"childComponent\"/>\n  <encapsulation>\n    <component_ref component=\"parentComponent\">\n      <component_ref component=\"childComponent\">\n        <component_ref component=\"importedComponent\"/>\n      </component_ref>\n    </component_ref>\n  </encapsulation>\n</model>\n"
             ,(allocator<char> *)local_80);
  libcellml::Parser::create(SUB81(&parser,0));
  libcellml::Parser::parseModel((string *)&model);
  bVar1 = (bool)model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_1_;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_80,"importedComponent",aaStack_98);
  libcellml::ComponentEntity::component(local_90,bVar1);
  gtest_ar_.success_ = (bool)libcellml::ImportedEntity::isImport();
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_88);
  std::__cxx11::string::~string((string *)local_80);
  if (gtest_ar_.success_ == false) {
    testing::Message::Message((Message *)local_90);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)local_80,&gtest_ar_.success_,
               "model->component(\"importedComponent\")->isImport()","false");
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)aaStack_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/parser/parser.cpp"
               ,0x9ae,local_80[0]);
    testing::internal::AssertHelper::operator=((AssertHelper *)aaStack_98,(Message *)local_90);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)aaStack_98);
    std::__cxx11::string::~string((string *)local_80);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_90);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  bVar1 = (bool)model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_1_;
  std::__cxx11::string::string<std::allocator<char>>((string *)local_80,"childComponent",aaStack_98)
  ;
  libcellml::ComponentEntity::component(local_90,bVar1);
  bVar2 = libcellml::ImportedEntity::isImport();
  gtest_ar_.success_ = (bool)(bVar2 ^ 1);
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_88);
  std::__cxx11::string::~string((string *)local_80);
  if (gtest_ar_.success_ == false) {
    testing::Message::Message((Message *)local_90);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)local_80,&gtest_ar_.success_,
               "model->component(\"childComponent\")->isImport()","true");
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)aaStack_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/parser/parser.cpp"
               ,0x9af,local_80[0]);
    testing::internal::AssertHelper::operator=((AssertHelper *)aaStack_98,(Message *)local_90);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)aaStack_98);
    std::__cxx11::string::~string((string *)local_80);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_90);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_80,"parentComponent",aaStack_98);
  libcellml::ComponentEntity::component
            (local_90,(bool)model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr._0_1_);
  bVar2 = libcellml::ImportedEntity::isImport();
  gtest_ar_.success_ = (bool)(bVar2 ^ 1);
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_88);
  std::__cxx11::string::~string((string *)local_80);
  if (bVar2 != 0) {
    testing::Message::Message((Message *)local_90);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)local_80,&gtest_ar_.success_,
               "model->component(\"parentComponent\")->isImport()","true");
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)aaStack_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/parser/parser.cpp"
               ,0x9b0,local_80[0]);
    testing::internal::AssertHelper::operator=((AssertHelper *)aaStack_98,(Message *)local_90);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)aaStack_98);
    std::__cxx11::string::~string((string *)local_80);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_90);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&parser.super___shared_ptr<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__cxx11::string::~string((string *)&modelString);
  return;
}

Assistant:

TEST(Parser, importComponentMadeConcrete)
{
    const std::string modelString =
        "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n"
        "<model xmlns=\"http://www.cellml.org/cellml/2.0#\">\n"
        "  <import xmlns:xlink=\"http://www.w3.org/1999/xlink\" xlink:href=\"some-other-model.xml\">\n"
        "    <component component_ref=\"importMe\" name=\"importedComponent\"/>\n"
        "  </import>\n"
        "  <component name=\"parentComponent\"/>\n"
        "  <component name=\"childComponent\"/>\n"
        "  <encapsulation>\n"
        "    <component_ref component=\"parentComponent\">\n"
        "      <component_ref component=\"childComponent\">\n"
        "        <component_ref component=\"importedComponent\"/>\n"
        "      </component_ref>\n"
        "    </component_ref>\n"
        "  </encapsulation>\n"
        "</model>\n";

    auto parser = libcellml::Parser::create();
    auto model = parser->parseModel(modelString);

    EXPECT_TRUE(model->component("importedComponent")->isImport());
    EXPECT_FALSE(model->component("childComponent")->isImport());
    EXPECT_FALSE(model->component("parentComponent")->isImport());
}